

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

void __thiscall DSDcc::Viterbi::initCodes(Viterbi *this)

{
  long lVar1;
  long lVar2;
  uchar dataBit;
  uchar symbol;
  uchar local_2a;
  uchar local_29;
  
  if (this->m_k != 0x20) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      local_2a = '\0';
      encodeToSymbols(this,&local_29,&local_2a,1,(uint)lVar2);
      this->m_branchCodes[lVar2] = local_29;
      local_2a = '\x01';
      encodeToSymbols(this,&local_29,&local_2a,1,(uint)lVar2);
      this->m_branchCodes[lVar2 + 1] = local_29;
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 2;
    } while (lVar1 < 1 << ((char)this->m_k - 1U & 0x1f));
  }
  return;
}

Assistant:

void Viterbi::initCodes()
{
	unsigned char symbol;
	unsigned char dataBit;

	for (int i = 0; i < (1<<(m_k-1)); i++)
	{
		dataBit = 0;
		encodeToSymbols(&symbol, &dataBit, 1, i<<1);
		m_branchCodes[2*i] = symbol;
        dataBit = 1;
        encodeToSymbols(&symbol, &dataBit, 1, i<<1);
        m_branchCodes[2*i+1] = symbol;
	}
}